

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

string * __thiscall
leveldb::(anonymous_namespace)::PosixWritableFile::GetName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)this + 0x10018));
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

virtual std::string GetName() const override { return filename_; }